

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

int zt_opt_help_stdout(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error)

{
  int iVar1;
  undefined8 *in_RCX;
  int in_ESI;
  long in_R8;
  code *in_R9;
  char *help;
  int i;
  char *local_50;
  int local_34;
  
  local_50 = *(char **)(in_R8 + (long)in_ESI * 0x30 + 0x20);
  if (local_50 == (char *)0x0) {
    local_50 = "";
  }
  printf("Usage: %s %s\nOptions:\n",*in_RCX,local_50);
  local_34 = 0;
  while( true ) {
    if (*(long *)(in_R8 + (long)local_34 * 0x30 + 0x18) == 0) {
      (*in_R9)(0,0);
      return 0;
    }
    iVar1 = _zt_opt_help_stdout_printer((zt_opt_def_t *)error);
    if (iVar1 < 0) break;
    local_34 = local_34 + 1;
  }
  (*in_R9)(0,"Programmer Error: must have a short or long opt at least",0);
  return -1;
}

Assistant:

int
zt_opt_help_stdout(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    int    i;
    char * help = def[defn].cb_data;

    printf("Usage: %s %s\nOptions:\n", argv[0], help ? help : "");

    for (i = 0; def[i].cb; i++) {
        if (_zt_opt_help_stdout_printer(&def[i]) < 0) {
            error(0, "Programmer Error: must have a short or long opt at least", NULL);
            return -1;
        }
    }

    error(0, NULL);

    return 0;
}